

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SFormat.cpp
# Opt level: O0

void slang::SFormat::formatInt(string *result,SVInt *value,LiteralBase base,FormatOptions *options)

{
  SVInt *this;
  bool bVar1;
  uint *puVar2;
  size_type sVar3;
  iterator __first;
  iterator __last;
  double dVar4;
  undefined1 local_b0 [8];
  anon_class_32_4_0e84af77 doPad;
  bitwidth_t bw;
  uint32_t width;
  SVInt copy;
  undefined1 local_68 [8];
  SmallVector<char,_40UL> buffer;
  FormatOptions *options_local;
  SVInt *pSStack_18;
  LiteralBase base_local;
  SVInt *value_local;
  string *result_local;
  
  buffer._56_8_ = options;
  options_local._7_1_ = base;
  pSStack_18 = value;
  value_local = (SVInt *)result;
  SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)local_68);
  if ((options_local._7_1_ == Decimal) || (bVar1 = SVInt::isSigned(pSStack_18), !bVar1)) {
    SVInt::writeTo(pSStack_18,(SmallVectorBase<char> *)local_68,options_local._7_1_,false,0xffffff);
  }
  else {
    SVInt::SVInt((SVInt *)&bw,pSStack_18);
    SVInt::setSigned((SVInt *)&bw,false);
    SVInt::writeTo((SVInt *)&bw,(SmallVectorBase<char> *)local_68,options_local._7_1_,false,0xffffff
                  );
    SVInt::~SVInt((SVInt *)&bw);
  }
  doPad.buffer._4_4_ = 0;
  bVar1 = std::optional::operator_cast_to_bool((optional *)buffer._56_8_);
  if (bVar1) {
    puVar2 = std::optional<unsigned_int>::operator*((optional<unsigned_int> *)buffer._56_8_);
    doPad.buffer._4_4_ = *puVar2;
  }
  else {
    doPad.buffer._0_4_ = SVInt::getBitWidth(pSStack_18);
    switch(options_local._7_1_) {
    case Binary:
      doPad.buffer._4_4_ = (bitwidth_t)doPad.buffer;
      break;
    case Octal:
      dVar4 = ceil((double)(bitwidth_t)doPad.buffer / 3.0);
      doPad.buffer._4_4_ = (bitwidth_t)(long)dVar4;
      break;
    case Decimal:
      dVar4 = ceil((double)(bitwidth_t)doPad.buffer / log2_10);
      doPad.buffer._4_4_ = (bitwidth_t)(long)dVar4;
      bVar1 = SVInt::isSigned(pSStack_18);
      if (bVar1) {
        doPad.buffer._4_4_ = doPad.buffer._4_4_ + 1;
      }
      break;
    case Hex:
      dVar4 = ceil((double)(bitwidth_t)doPad.buffer * 0.25);
      doPad.buffer._4_4_ = (bitwidth_t)(long)dVar4;
    }
  }
  local_b0 = (undefined1  [8])((long)&options_local + 7);
  doPad.base = (LiteralBase *)value_local;
  doPad.result = (string *)((long)&doPad.buffer + 4);
  doPad.width = (uint32_t *)local_68;
  sVar3 = SmallVectorBase<char>::size((SmallVectorBase<char> *)local_68);
  if ((sVar3 < doPad.buffer._4_4_) && ((*(byte *)(buffer._56_8_ + 0x10) & 1) == 0)) {
    formatInt::anon_class_32_4_0e84af77::operator()((anon_class_32_4_0e84af77 *)local_b0);
  }
  this = value_local;
  __first = SmallVectorBase<char>::begin((SmallVectorBase<char> *)local_68);
  __last = SmallVectorBase<char>::end((SmallVectorBase<char> *)local_68);
  std::__cxx11::string::append<char*,void>((string *)this,__first,__last);
  sVar3 = SmallVectorBase<char>::size((SmallVectorBase<char> *)local_68);
  if ((sVar3 < doPad.buffer._4_4_) && ((*(byte *)(buffer._56_8_ + 0x10) & 1) != 0)) {
    formatInt::anon_class_32_4_0e84af77::operator()((anon_class_32_4_0e84af77 *)local_b0);
  }
  SmallVector<char,_40UL>::~SmallVector((SmallVector<char,_40UL> *)local_68);
  return;
}

Assistant:

void formatInt(std::string& result, const SVInt& value, LiteralBase base,
               const FormatOptions& options) {
    SmallVector<char> buffer;
    if (base != LiteralBase::Decimal && value.isSigned()) {
        // Non-decimal bases don't print as signed ever.
        SVInt copy = value;
        copy.setSigned(false);
        copy.writeTo(buffer, base, /* includeBase */ false);
    }
    else {
        value.writeTo(buffer, base, /* includeBase */ false);
    }

    // If no width is specified we need to calculate it ourselves based on the bitwidth
    // of the provided integer.
    uint32_t width = 0;
    if (options.width)
        width = *options.width;
    else {
        bitwidth_t bw = value.getBitWidth();
        switch (base) {
            case LiteralBase::Binary:
                width = bw;
                break;
            case LiteralBase::Octal:
                width = uint32_t(ceil(bw / 3.0));
                break;
            case LiteralBase::Hex:
                width = uint32_t(ceil(bw / 4.0));
                break;
            case LiteralBase::Decimal:
                width = uint32_t(ceil(bw / log2_10));
                if (value.isSigned())
                    width++;
                break;
        }
    }

    auto doPad = [&] {
        char pad = '0';
        if (base == LiteralBase::Decimal)
            pad = ' ';

        result.append(width - buffer.size(), pad);
    };

    if (buffer.size() < width && !options.leftJustify)
        doPad();

    result.append(buffer.begin(), buffer.end());

    if (buffer.size() < width && options.leftJustify)
        doPad();
}